

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::resolver::async_resolve
          (resolver *this,string *host,resolver_flags flags,callback_t *h)

{
  long lVar1;
  long lVar2;
  pointer paVar3;
  io_context *piVar4;
  pointer pcVar5;
  size_type sVar6;
  iterator iVar7;
  time_point tVar8;
  iterator iVar9;
  long *plVar10;
  iterator __pos;
  executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  *peVar11;
  undefined8 uVar12;
  string_view host_00;
  string_view host_01;
  string_view service;
  string_view service_00;
  ptr local_f8;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ips;
  error_code ec;
  code *local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  error_code local_98;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> local_88;
  unsigned_long local_70;
  error_code error_code;
  address ip;
  
  ec.val_ = 0;
  ec._4_4_ = ec._4_4_ & 0xffffff00;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::ip::make_address(&ip,host,&ec);
  if (ec.failed_ == false) {
    paVar3 = (pointer)this->m_ios;
    ::std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                *)local_b8,h);
    local_98._0_8_ = CONCAT44(ec._4_4_,ec.val_);
    local_98.cat_ = ec.cat_;
    local_88.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ip._0_8_;
    local_88.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = ip.ipv6_address_.addr_.__in6_u.__u6_addr32[0]
    ;
    local_88.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = ip.ipv6_address_.addr_.__in6_u.__u6_addr32[1]
    ;
    local_88.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         ip.ipv6_address_.addr_.__in6_u.__u6_addr32[2];
    local_88.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         ip.ipv6_address_.addr_.__in6_u.__u6_addr32[3];
    local_70 = ip.ipv6_address_.scope_id_;
    local_f8.a = (allocator<void> *)
                 &ips.
                  super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    ips.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = 1;
    ips.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
    _M_impl.super__Vector_impl_data._M_start = paVar3;
    plVar10 = (long *)__tls_get_addr(&PTR_004d3f18);
    if (*plVar10 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = *(undefined8 *)(*plVar10 + 8);
    }
    peVar11 = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
               *)boost::asio::detail::thread_info_base::
                 allocate<boost::asio::detail::thread_info_base::default_tag>(uVar12,0x70);
    (peVar11->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
    (peVar11->super_scheduler_operation).func_ =
         boost::asio::detail::
         executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         ::do_complete;
    (peVar11->super_scheduler_operation).task_result_ = 0;
    local_f8.v = peVar11;
    async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)
    ::$_0::__0((__0 *)&peVar11->handler_,(type *)local_b8);
    local_f8.p = peVar11;
    boost::asio::detail::scheduler::post_immediate_completion
              (*(scheduler **)
                &((ips.
                   super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                   ._M_impl.super__Vector_impl_data._M_start)->ipv6_address_).addr_.__in6_u,
               (operation *)peVar11,
               SUB41((ips.
                      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_4_ & 2) >> 1,0));
    local_f8.v = (void *)0x0;
    local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                  *)0x0;
    boost::asio::detail::
    executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
    ::ptr::reset(&local_f8);
  }
  else {
    ec.val_ = 0;
    ec._4_4_ = ec._4_4_ & 0xffffff00;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    iVar7 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_cache)._M_h,host);
    if ((iVar7.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
         ._M_cur != (__node_type *)0x0) &&
       (((flags.m_val & 1) != 0 ||
        (lVar1 = (this->m_timeout).__r,
        lVar2 = *(long *)((long)iVar7.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                                ._M_cur + 0x28), tVar8 = time_now(),
        (long)tVar8.__d.__r <= lVar1 + lVar2)))) {
      ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                (&ips,(vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *
                      )((long)iVar7.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                              ._M_cur + 0x30));
      piVar4 = this->m_ios;
      ::std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)local_b8,h);
      local_98._0_8_ = CONCAT44(ec._4_4_,ec.val_);
      local_98.cat_ = ec.cat_;
      ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                (&local_88,&ips);
      local_f8.a = (allocator<void> *)&error_code.cat_;
      error_code.cat_ = (error_category *)CONCAT44(1,error_code.cat_._0_4_);
      error_code._0_8_ = piVar4;
      plVar10 = (long *)__tls_get_addr(&PTR_004d3f18);
      if (*plVar10 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = *(undefined8 *)(*plVar10 + 8);
      }
      peVar11 = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                 *)boost::asio::detail::thread_info_base::
                   allocate<boost::asio::detail::thread_info_base::default_tag>(uVar12,0x68);
      (peVar11->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
      (peVar11->super_scheduler_operation).func_ =
           boost::asio::detail::
           executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:124:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      (peVar11->super_scheduler_operation).task_result_ = 0;
      local_f8.v = peVar11;
      async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)
      ::$_1::__1((__1 *)&peVar11->handler_,(type *)local_b8);
      local_f8.p = peVar11;
      boost::asio::detail::scheduler::post_immediate_completion
                (*(scheduler **)(error_code._0_8_ + 8),(operation *)peVar11,
                 SUB41((error_code.cat_._4_4_ & 2) >> 1,0));
      local_f8.v = (void *)0x0;
      local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)0x0;
      boost::asio::detail::
      executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:124:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
      ::ptr::reset((ptr *)&local_f8);
      async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)
      ::$_1::~__1((__1 *)local_b8);
      ::std::_Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
      ~_Vector_base(&ips.
                     super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                   );
      return;
    }
    iVar9 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_failed_cache)._M_h,host);
    if (iVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
        ._M_cur == (__node_type *)0x0) {
      if ((flags.m_val & 1) == 0) goto LAB_00272a0e;
      paVar3 = (pointer)this->m_ios;
      ::std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)local_b8,h);
      local_f8.a = (allocator<void> *)
                   &ips.
                    super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      ips.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 1;
      ips.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_start = paVar3;
      plVar10 = (long *)__tls_get_addr(&PTR_004d3f18);
      if (*plVar10 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = *(undefined8 *)(*plVar10 + 8);
      }
      local_f8.v = boost::asio::detail::thread_info_base::
                   allocate<boost::asio::detail::thread_info_base::default_tag>(uVar12,0x40);
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->super_scheduler_operation).func_ =
           boost::asio::detail::
           executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:145:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->super_scheduler_operation).task_result_ = 0;
      *(undefined8 *)
       &(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).h.super__Function_base._M_functor = 0;
      *(undefined8 *)
       ((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                  *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) = 0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->handler_).h.super__Function_base._M_manager = (_Manager_type)0x0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_f8.v)->handler_).h._M_invoker = (_Invoker_type)local_a8._8_8_;
      if ((_Manager_type)local_a8._M_allocated_capacity != (_Manager_type)0x0) {
        *(code **)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                      *)local_f8.v)->handler_).h.super__Function_base._M_functor = local_b8[0];
        *(code **)((long)&(((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                             *)local_f8.v)->handler_).h.super__Function_base._M_functor + 8) =
             local_b8[1];
        (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           *)local_f8.v)->handler_).h.super__Function_base._M_manager =
             (_Manager_type)local_a8._M_allocated_capacity;
        local_a8._M_allocated_capacity = 0;
        local_a8._8_8_ = (_Invoker_type)0x0;
      }
      local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)local_f8.v;
      boost::asio::detail::scheduler::post_immediate_completion
                (*(scheduler **)
                  &((ips.
                     super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                     ._M_impl.super__Vector_impl_data._M_start)->ipv6_address_).addr_.__in6_u,
                 (operation *)local_f8.v,
                 SUB41((ips.
                        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_ & 2) >> 1,0));
      local_f8.v = (void *)0x0;
      local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)0x0;
      boost::asio::detail::
      executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:145:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
      ::ptr::reset((ptr *)&local_f8);
    }
    else {
      if (((flags.m_val & 1) == 0) &&
         (lVar1 = (this->m_timeout).__r,
         lVar2 = *(long *)((long)iVar9.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                                 ._M_cur + 0x28), tVar8 = time_now(),
         lVar1 + lVar2 < (long)tVar8.__d.__r)) {
LAB_00272a0e:
        __pos = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
                ::find(&(this->m_callbacks)._M_t,host);
        ::std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
        ::
        pair<std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
                    *)local_b8,host,h);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>>
        ::
        _M_insert_equal_<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>>>>
                    *)&this->m_callbacks,(const_iterator)__pos._M_node,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
                    *)local_b8);
        ::std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
                 *)local_b8);
        if ((_Rb_tree_header *)__pos._M_node !=
            &(this->m_callbacks)._M_t._M_impl.super__Rb_tree_header) {
          return;
        }
        pcVar5 = (host->_M_dataplus)._M_p;
        sVar6 = host->_M_string_length;
        local_88.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)this;
        if ((flags.m_val & 2) == 0) {
          local_b8[0] = on_lookup;
          local_b8[1] = (code *)0x0;
          ::std::__cxx11::string::string((string *)local_a8._M_local_buf,(string *)host);
          host_00._M_str = pcVar5;
          host_00._M_len = sVar6;
          service._M_str = "80";
          service._M_len = 2;
          boost::asio::ip::
          basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
          ::
          async_resolve<std::_Bind<void(libtorrent::aux::resolver::*(libtorrent::aux::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&)>>
                    ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                      *)&this->m_critical_resolver,host_00,service,
                     (_Bind<void_(libtorrent::aux::resolver::*(libtorrent::aux::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_b8);
        }
        else {
          local_b8[0] = on_lookup;
          local_b8[1] = (code *)0x0;
          ::std::__cxx11::string::string((string *)local_a8._M_local_buf,(string *)host);
          host_01._M_str = pcVar5;
          host_01._M_len = sVar6;
          service_00._M_str = "80";
          service_00._M_len = 2;
          boost::asio::ip::
          basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
          ::
          async_resolve<std::_Bind<void(libtorrent::aux::resolver::*(libtorrent::aux::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&)>>
                    ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                      *)&this->m_resolver,host_01,service_00,
                     (_Bind<void_(libtorrent::aux::resolver::*(libtorrent::aux::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_b8);
        }
        ::std::__cxx11::string::~string((string *)local_a8._M_local_buf);
        return;
      }
      error_code._0_8_ =
           *(undefined8 *)
            ((long)iVar9.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                   ._M_cur + 0x30);
      error_code.cat_ =
           *(error_category **)
            ((long)iVar9.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                   ._M_cur + 0x38);
      paVar3 = (pointer)this->m_ios;
      ::std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)local_b8,h);
      local_98._0_8_ = error_code._0_8_;
      local_98.cat_ = error_code.cat_;
      local_f8.a = (allocator<void> *)
                   &ips.
                    super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      ips.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 1;
      ips.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_start = paVar3;
      plVar10 = (long *)__tls_get_addr(&PTR_004d3f18);
      if (*plVar10 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = *(undefined8 *)(*plVar10 + 8);
      }
      peVar11 = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                 *)boost::asio::detail::thread_info_base::
                   allocate<boost::asio::detail::thread_info_base::default_tag>(uVar12,0x50);
      (peVar11->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
      (peVar11->super_scheduler_operation).func_ =
           boost::asio::detail::
           executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:137:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      (peVar11->super_scheduler_operation).task_result_ = 0;
      local_f8.v = peVar11;
      async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)
      ::$_2::__2((__2 *)&peVar11->handler_,(type *)local_b8);
      local_f8.p = peVar11;
      boost::asio::detail::scheduler::post_immediate_completion
                (*(scheduler **)
                  &((ips.
                     super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                     ._M_impl.super__Vector_impl_data._M_start)->ipv6_address_).addr_.__in6_u,
                 (operation *)peVar11,
                 SUB41((ips.
                        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_ & 2) >> 1,0));
      local_f8.v = (void *)0x0;
      local_f8.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_resolver_cpp:111:16),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)0x0;
      boost::asio::detail::
      executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/resolver.cpp:137:17),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
      ::ptr::reset((ptr *)&local_f8);
    }
  }
  ::std::_Function_base::~_Function_base((_Function_base *)local_b8);
  return;
}

Assistant:

void resolver::async_resolve(std::string const& host, resolver_flags const flags
		, resolver_interface::callback_t h)
	{
		// special handling for raw IP addresses. There's no need to get in line
		// behind actual lookups if we can just resolve it immediately.
		error_code ec;
		address const ip = make_address(host, ec);
		if (!ec)
		{
			post(m_ios, [h, ec, ip]{ callback(h, ec, std::vector<address>{ip}); });
			return;
		}
		ec.clear();

		auto const i = m_cache.find(host);
		if (i != m_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| i->second.last_seen + m_timeout >= time_now())
			{
				std::vector<address> ips = i->second.addresses;
				post(m_ios, [h, ec, ips] { callback(h, ec, ips); });
				return;
			}
		}

		auto const k = m_failed_cache.find(host);
		if (k != m_failed_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| k->second.last_seen + m_timeout >= time_now())
			{
				error_code error_code = k->second.error;
				post(m_ios, [h, error_code] { callback(h, error_code, {}); });
				return;
			}
		}

		if (flags & resolver_interface::cache_only)
		{
			// we did not find a cache entry, fail the lookup
			post(m_ios, [h] {
				callback(h, boost::asio::error::host_not_found, std::vector<address>{});
			});
			return;
		}

		auto iter = m_callbacks.find(host);
		bool const done = (iter != m_callbacks.end());

		m_callbacks.insert(iter, {host, std::move(h)});

		// if there is an existing outtanding lookup, our callback will be
		// called once it completes. We're done here.
		if (done) return;

		// the port is ignored
		using namespace std::placeholders;
		ADD_OUTSTANDING_ASYNC("resolver::on_lookup");
		if (flags & resolver_interface::abort_on_shutdown)
		{
			m_resolver.async_resolve(host, "80", std::bind(&resolver::on_lookup, this, _1, _2
				, host));
		}
		else
		{
			m_critical_resolver.async_resolve(host, "80", std::bind(&resolver::on_lookup, this, _1, _2
				, host));
		}
	}